

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                 *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<std::complex<double>_> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZFileEqnStorage<std::complex<double>_> *this_02;
  
  this_02 = (TPZFileEqnStorage<std::complex<double>_> *)0x0;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<double>_>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_02545678;
  TPZFileEqnStorage<std::complex<double>_>::TPZFileEqnStorage(this_02);
  this_00 = in_RDI + 0xd8;
  TPZFrontNonSym<std::complex<double>_>::TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<double>_> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x210);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x230));
  TPZFrontNonSym<std::complex<double>_>::Reset
            ((TPZFrontNonSym<std::complex<double>_> *)this_00,(int64_t)this_01);
  TPZFileEqnStorage<std::complex<double>_>::Reset
            ((TPZFileEqnStorage<std::complex<double>_> *)(in_RDI + 0x20));
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x208) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x200) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}